

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.hpp
# Opt level: O1

void __thiscall
helics::ValueFederate::publishBytes
          (ValueFederate *this,Publication *pub,char *data,size_t data_size)

{
  data_view local_28;
  
  local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.dblock._M_len = data_size;
  local_28.dblock._M_str = data;
  publishBytes(this,pub,&local_28);
  if (local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.ref.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void publishBytes(const Publication& pub, const char* data, size_t data_size)
    {
        publishBytes(pub, data_view{data, data_size});
    }